

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Observed.cpp
# Opt level: O3

void set_encrypted_data_keystring(SRUP_MSG_OBS_BASE *self,string *s,char *key)

{
  ulong uVar1;
  
  uVar1 = s->_M_string_length;
  if (uVar1 < 0x20) {
    std::__cxx11::string::_M_replace_aux((ulong)s,uVar1,0,' ' - (char)uVar1);
    uVar1 = s->_M_string_length;
  }
  SRUP_MSG_OBS_BASE::encrypt_data(self,(uint8_t *)(s->_M_dataplus)._M_p,(uint16_t)uVar1,true,key);
  return;
}

Assistant:

void set_encrypted_data_keystring (SRUP_MSG_OBS_BASE& self, std::string s, char* key)
{
    // As above, by definition our encrypted data will be 16-bytes in length.
    // But we'll expect that for type-conversion with Python, we'll actually use a 32-character string
    // We don't need to trim it if it's longer - as the underlying method will take care of that for us
    // Given that we're specifying the length of 32 here...
    // If it's less than 32 chars – we'll pad it with 0's
    if (s.length() < 32)
        s.append(32-s.length(), 0);

    self.encrypt_data((uint8_t*) s.c_str(), s.length(), true, key);
}